

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::WriteObjectsVariable
          (cmMakefileTargetGenerator *this,string *variableName,string *variableNameExternal,
          bool useWatcomQuote)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  string *psVar3;
  type pcVar4;
  ostream *poVar5;
  string_view str;
  string local_1d8;
  string local_1b8;
  reference local_198;
  string *obj_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string local_170;
  string local_150;
  string local_130;
  string *local_110;
  string_view local_108;
  reference local_f8;
  string *obj;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_d0;
  cmValue local_b0;
  cmValue pchExtension;
  string *lineContinue;
  string object;
  allocator<char> local_69;
  string local_68;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool useWatcomQuote_local;
  string *variableNameExternal_local;
  string *variableName_local;
  cmMakefileTargetGenerator *this_local;
  
  pcVar1 = this->LocalGenerator;
  local_21 = useWatcomQuote;
  psStack_20 = variableNameExternal;
  variableNameExternal_local = variableName;
  variableName_local = (string *)this;
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"_OBJECTS",&local_69);
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_48,pcVar1,psVar3,&local_68);
  std::__cxx11::string::operator=((string *)variableNameExternal_local,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->BuildFileStream);
  poVar5 = std::operator<<((ostream *)pcVar4,"# Object files for target ");
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar5 = std::operator<<(poVar5,(string *)psVar3);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,(string *)variableNameExternal_local);
  std::operator<<(poVar5," =");
  std::__cxx11::string::string((string *)&lineContinue);
  pchExtension.Value = &this->GlobalGenerator->LineContinueDirective;
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"CMAKE_PCH_EXTENSION",(allocator<char> *)((long)&__range1 + 7));
  local_b0 = cmMakefile::GetDefinition(this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Objects);
  obj = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->Objects);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&obj);
    if (!bVar2) break;
    local_f8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_f8);
    local_110 = local_b0.Value;
    local_108 = str;
    bVar2 = cmHasSuffix(str,local_b0);
    if (!bVar2) {
      pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->BuildFileStream);
      poVar5 = std::operator<<((ostream *)pcVar4," ");
      std::operator<<(poVar5,(string *)pchExtension.Value);
      pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->BuildFileStream);
      cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath
                (&local_130,local_f8,(bool)(local_21 & 1));
      std::operator<<((ostream *)pcVar4,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->BuildFileStream);
  std::operator<<((ostream *)pcVar4,"\n");
  pcVar1 = this->LocalGenerator;
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"_EXTERNAL_OBJECTS",(allocator<char> *)((long)&__range1_1 + 7));
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_150,pcVar1,psVar3,&local_170);
  std::__cxx11::string::operator=((string *)psStack_20,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
  pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->BuildFileStream);
  poVar5 = std::operator<<((ostream *)pcVar4,"\n");
  poVar5 = std::operator<<(poVar5,"# External object files for target ");
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar5 = std::operator<<(poVar5,(string *)psVar3);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,(string *)psStack_20);
  std::operator<<(poVar5," =");
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->ExternalObjects);
  obj_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->ExternalObjects);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&obj_1);
    if (!bVar2) break;
    local_198 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&local_1b8,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,local_198);
    std::__cxx11::string::operator=((string *)&lineContinue,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->BuildFileStream);
    poVar5 = std::operator<<((ostream *)pcVar4," ");
    std::operator<<(poVar5,(string *)pchExtension.Value);
    pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->BuildFileStream);
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath
              (&local_1d8,local_198,(bool)(local_21 & 1));
    std::operator<<((ostream *)pcVar4,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->BuildFileStream);
  poVar5 = std::operator<<((ostream *)pcVar4,"\n");
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&lineContinue);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsVariable(
  std::string& variableName, std::string& variableNameExternal,
  bool useWatcomQuote)
{
  // Write a make variable assignment that lists all objects for the
  // target.
  variableName = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_OBJECTS");
  *this->BuildFileStream << "# Object files for target "
                         << this->GeneratorTarget->GetName() << "\n"
                         << variableName << " =";
  std::string object;
  const auto& lineContinue = this->GlobalGenerator->LineContinueDirective;

  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

  for (std::string const& obj : this->Objects) {
    if (cmHasSuffix(obj, pchExtension)) {
      continue;
    }
    *this->BuildFileStream << " " << lineContinue;
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n";

  // Write a make variable assignment that lists all external objects
  // for the target.
  variableNameExternal = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_EXTERNAL_OBJECTS");
  /* clang-format off */
  *this->BuildFileStream
    << "\n"
    << "# External object files for target "
    << this->GeneratorTarget->GetName() << "\n"
    << variableNameExternal << " =";
  /* clang-format on */
  for (std::string const& obj : this->ExternalObjects) {
    object = this->LocalGenerator->MaybeRelativeToCurBinDir(obj);
    *this->BuildFileStream << " " << lineContinue;
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n"
                         << "\n";
}